

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_update_ghosts(Integer g_a)

{
  logical lVar1;
  Integer handle;
  int local_sync_end;
  int local_sync_begin;
  Integer in_stack_00000178;
  Integer in_stack_00000d40;
  int iVar2;
  int iVar3;
  
  iVar2 = _ga_sync_end;
  iVar3 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar3 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar3,iVar2));
  }
  lVar1 = pnga_update4_ghosts(in_stack_00000178);
  if (lVar1 == 0) {
    pnga_update1_ghosts(in_stack_00000d40);
  }
  if (iVar2 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar3,iVar2));
  }
  return;
}

Assistant:

void pnga_update_ghosts(Integer g_a)
{
  /* Wrapper program for ghost cell update operations. If optimized
     update operation fails then use slow but robust version of
     update operation */
   int local_sync_begin,local_sync_end;
   Integer handle = GA_OFFSET + g_a;

   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_pgroup_sync(GA[handle].p_handle);

   if (!pnga_update4_ghosts(g_a))
   {
     pnga_update1_ghosts(g_a);
   }

   if(local_sync_end)pnga_pgroup_sync(GA[handle].p_handle);
}